

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_2(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  shared_ptr<Pl_StdioFile> out;
  QPDFObjectHandle pages;
  QPDFObjectHandle root;
  QPDFObjectHandle kids;
  QPDFObjectHandle encrypt;
  QPDFObjectHandle trailer;
  QPDFObjectHandle contents;
  QPDFObjectHandle page;
  Pl_StdioFile *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  long local_d0 [2];
  string local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined1 local_a9;
  long *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  long local_98 [2];
  string local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  QPDF::getTrailer();
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Info","");
  QPDFObjectHandle::getKey(local_88);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/CreationDate","");
  QPDFObjectHandle::getKey(local_c0);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_e0,(long)local_d8._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/Info","");
  QPDFObjectHandle::getKey(local_88);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/Producer","");
  QPDFObjectHandle::getKey(local_c0);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_e0,(long)local_d8._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_e0 = (Pl_StdioFile *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/Encrypt","");
  QPDFObjectHandle::getKey((string *)&local_78);
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/O","");
  QPDFObjectHandle::getKey(local_c0);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_e0,(long)local_d8._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/U","");
  QPDFObjectHandle::getKey(local_c0);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_e0,(long)local_d8._M_pi);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  QPDF::getRoot();
  local_e0 = (Pl_StdioFile *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/Pages","");
  QPDFObjectHandle::getKey(local_c0);
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  local_e0 = (Pl_StdioFile *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/Kids","");
  QPDFObjectHandle::getKey(local_88);
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  QPDFObjectHandle::getArrayItem((int)local_38);
  local_e0 = (Pl_StdioFile *)local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/Contents","");
  QPDFObjectHandle::getKey(local_48);
  if (local_e0 != (Pl_StdioFile *)local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  QUtil::binary_stdout();
  local_e0 = (Pl_StdioFile *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Pl_StdioFile,std::allocator<Pl_StdioFile>,char_const(&)[9],_IO_FILE*&>
            (&local_d8,&local_e0,(allocator<Pl_StdioFile> *)&local_a9,(char (*) [9])"filtered",
             (_IO_FILE **)&stdout);
  QPDFObjectHandle::pipeStreamData((Pipeline *)local_48,(int)local_e0,qpdf_dl_none,true,false);
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

static void
test_2(QPDF& pdf, char const* arg2)
{
    // Encrypted file.  This test case is designed for a specific
    // PDF file.

    QPDFObjectHandle trailer = pdf.getTrailer();
    std::cout << trailer.getKey("/Info").getKey("/CreationDate").getStringValue() << std::endl;
    std::cout << trailer.getKey("/Info").getKey("/Producer").getStringValue() << std::endl;

    QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
    std::cout << encrypt.getKey("/O").unparse() << std::endl;
    std::cout << encrypt.getKey("/U").unparse() << std::endl;

    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle pages = root.getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");
    QPDFObjectHandle page = kids.getArrayItem(1); // second page
    QPDFObjectHandle contents = page.getKey("/Contents");
    QUtil::binary_stdout();
    auto out = std::make_shared<Pl_StdioFile>("filtered", stdout);
    contents.pipeStreamData(out.get(), 0, qpdf_dl_generalized);
}